

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_subscript(CTcPrsNode *lhs)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *pCVar2;
  CTPNSubscript *pCVar3;
  CTcPrsNode *cval;
  CTcPrsNode *subscript;
  undefined8 in_stack_ffffffffffffffc8;
  int errnum;
  CTcTokenizer *in_stack_ffffffffffffffd0;
  CTcTokenizer *in_stack_ffffffffffffffd8;
  CTcPrsNode *in_stack_ffffffffffffffe0;
  CTcPrsOpBin *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  errnum = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  CTcTokenizer::next(in_stack_ffffffffffffffd8);
  pCVar2 = CTcPrsOpBin::parse(in_stack_ffffffffffffffe8);
  if (pCVar2 == (CTcPrsNode *)0x0) {
    local_8 = (CTPNSubscript *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2ab8be);
    if (tVar1 == TOKT_RBRACK) {
      CTcTokenizer::next(in_stack_ffffffffffffffd8);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffffd0,errnum);
    }
    local_8 = (CTPNSubscript *)
              eval_const_subscript
                        (in_stack_ffffffffffffffe0,(CTcPrsNode *)in_stack_ffffffffffffffd8);
    if (local_8 == (CTPNSubscript *)0x0) {
      pCVar3 = (CTPNSubscript *)CTcPrsAllocObj::operator_new(0x2ab91a);
      CTPNSubscript::CTPNSubscript
                (local_8,(CTcPrsNode *)in_stack_ffffffffffffffd8,
                 (CTcPrsNode *)in_stack_ffffffffffffffd0);
      local_8 = pCVar3;
    }
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_subscript(CTcPrsNode *lhs)
{
    /* skip the '[' */
    G_tok->next();

    /* parse the expression within the brackets */
    CTcPrsNode *subscript = S_op_comma.parse();
    if (subscript == 0)
        return 0;

    /* check for the matching ']' */
    if (G_tok->cur() == TOKT_RBRACK)
    {
        /* got it - skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and forgive the missing ']' */
        G_tok->log_error_curtok(TCERR_EXPECTED_SUB_RBRACK);
    }

    /* try folding constants */
    CTcPrsNode *cval = eval_const_subscript(lhs, subscript);

    /* 
     *   if that worked, use the result; otherwise, build an expression
     *   node to generate code for the subscript operator
     */
    if (cval != 0)
        return cval;
    else
        return new CTPNSubscript(lhs, subscript);
}